

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_str_replace(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  char *pcVar3;
  int local_104;
  uint local_100;
  sxu32 nOfft;
  sxu32 nCount;
  sxi32 rc;
  int nByte;
  int rep_str;
  SySet sSearch;
  SySet sReplace;
  SyBlob sWorker;
  str_replace_data sRep;
  char *zFunc;
  char *zIn;
  ProcStringMatch xMatch;
  SyString *pReplace;
  SyString *pSearch;
  SyString sTemp;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sTemp._8_8_ = apArg;
  if (nArg < 3) {
    jx9_result_null(pCtx);
  }
  else {
    SySetInit((SySet *)&nByte,&pCtx->pVm->sAllocator,0x10);
    SySetInit((SySet *)&sSearch.pUserData,&pCtx->pVm->sAllocator,0x10);
    SyBlobInit((SyBlob *)&sReplace.pUserData,&pCtx->pVm->sAllocator);
    SyZero(&sWorker.nFlags,0x20);
    rc = 0;
    pcVar3 = jx9_value_to_string(*(jx9_value **)(sTemp._8_8_ + 0x10),(int *)&nCount);
    if ((int)nCount < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else {
      SyBlobAppend((SyBlob *)&sReplace.pUserData,pcVar3,nCount);
      iVar1 = jx9_value_is_json_array(*(jx9_value **)sTemp._8_8_);
      if (iVar1 == 0) {
        pSearch = (SyString *)jx9_value_to_string(*(jx9_value **)sTemp._8_8_,(int *)&nCount);
        if ((int)nCount < 1) {
          jx9_result_value(pCtx,*(jx9_value **)(sTemp._8_8_ + 0x10));
          return 0;
        }
        sTemp.zString._0_4_ = nCount;
        SySetPut((SySet *)&nByte,&pSearch);
      }
      else {
        jx9_array_walk(*(jx9_value **)sTemp._8_8_,StrReplaceWalker,&sWorker.nFlags);
      }
      iVar1 = jx9_value_is_json_array(*(jx9_value **)(sTemp._8_8_ + 8));
      if (iVar1 == 0) {
        pSearch = (SyString *)jx9_value_to_string(*(jx9_value **)(sTemp._8_8_ + 8),(int *)&nCount);
        rc = 1;
        sTemp.zString._0_4_ = nCount;
        SySetPut((SySet *)&sSearch.pUserData,&pSearch);
      }
      else {
        jx9_array_walk(*(jx9_value **)(sTemp._8_8_ + 8),StrReplaceWalker,&sWorker.nFlags);
      }
      SySetResetCursor((SySet *)&nByte);
      SySetResetCursor((SySet *)&sSearch.pUserData);
      pReplace = (SyString *)0x0;
      xMatch = (ProcStringMatch)0x0;
      pSearch = (SyString *)0x16af6a;
      sTemp.zString._0_4_ = 0;
      pcVar3 = jx9_function_name(pCtx);
      zIn = (char *)SyBlobSearch;
      sVar2 = SyStrncmp(pcVar3,"str_ireplace",0xc);
      if (sVar2 == 0) {
        zIn = (char *)iPatternMatch;
      }
      while (sVar2 = SySetGetNextEntry((SySet *)&nByte,&pReplace), sVar2 == 0) {
        if (pReplace->nByte != 0) {
          if (rc == 0) {
            sVar2 = SySetGetNextEntry((SySet *)&sSearch.pUserData,&xMatch);
            if (sVar2 != 0) {
              xMatch = (ProcStringMatch)0x0;
            }
          }
          else {
            xMatch = (ProcStringMatch)SySetPeek((SySet *)&sSearch.pUserData);
          }
          if (xMatch == (ProcStringMatch)0x0) {
            xMatch = (ProcStringMatch)&pSearch;
          }
          local_100 = 0;
          local_104 = 0;
          while ((local_100 < (uint)sWorker.pBlob &&
                 (nOfft = (*(code *)zIn)((long)(sWorker.pAllocator)->apPool +
                                         ((ulong)local_100 - 0x40),(uint)sWorker.pBlob - local_100,
                                         pReplace->zString,pReplace->nByte,&local_104), nOfft == 0))
                ) {
            StringReplace((SyBlob *)&sReplace.pUserData,local_100 + local_104,pReplace->nByte,
                          *(char **)xMatch,*(int *)(xMatch + 8));
            local_100 = local_104 + *(int *)(xMatch + 8) + local_100;
          }
        }
      }
      jx9_result_string(pCtx,(char *)sWorker.pAllocator,(uint)sWorker.pBlob);
      SySetRelease((SySet *)&nByte);
      SySetRelease((SySet *)&sSearch.pUserData);
      SyBlobRelease((SyBlob *)&sReplace.pUserData);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_replace(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyString sTemp, *pSearch, *pReplace;
	ProcStringMatch xMatch;
	const char *zIn, *zFunc;
	str_replace_data sRep;
	SyBlob sWorker;
	SySet sReplace;
	SySet sSearch;
	int rep_str;
	int nByte;
	sxi32 rc;
	if( nArg < 3 ){
		/* Missing/Invalid arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Initialize fields */
	SySetInit(&sSearch, &pCtx->pVm->sAllocator, sizeof(SyString));
	SySetInit(&sReplace, &pCtx->pVm->sAllocator, sizeof(SyString));
	SyBlobInit(&sWorker, &pCtx->pVm->sAllocator);
	SyZero(&sRep, sizeof(str_replace_data));
	sRep.pCtx = pCtx;
	sRep.pCollector = &sSearch;
	rep_str = 0;
	/* Extract the subject */
	zIn = jx9_value_to_string(apArg[2], &nByte);
	if( nByte < 1 ){
		/* Nothing to replace, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Copy the subject */
	SyBlobAppend(&sWorker, (const void *)zIn, (sxu32)nByte);
	/* Search string */
	if( jx9_value_is_json_array(apArg[0]) ){
		/* Collect search string */
		jx9_array_walk(apArg[0], StrReplaceWalker, &sRep);
	}else{
		/* Single pattern */
		zIn = jx9_value_to_string(apArg[0], &nByte);
		if( nByte < 1 ){
			/* Return the subject untouched since no search string is available */
			jx9_result_value(pCtx, apArg[2]/* Subject as thrird argument*/);
			return JX9_OK;
		}
		SyStringInitFromBuf(&sTemp, zIn, nByte);
		/* Save for later processing */
		SySetPut(&sSearch, (const void *)&sTemp);
	}
	/* Replace string */
	if( jx9_value_is_json_array(apArg[1]) ){
		/* Collect replace string */
		sRep.pCollector = &sReplace;
		jx9_array_walk(apArg[1], StrReplaceWalker, &sRep);
	}else{
		/* Single needle */
		zIn = jx9_value_to_string(apArg[1], &nByte);
		rep_str = 1;
		SyStringInitFromBuf(&sTemp, zIn, nByte);
		/* Save for later processing */
		SySetPut(&sReplace, (const void *)&sTemp);
	}
	/* Reset loop cursors */
	SySetResetCursor(&sSearch);
	SySetResetCursor(&sReplace);
	pReplace = pSearch = 0; /* cc warning */
	SyStringInitFromBuf(&sTemp, "", 0);
	/* Extract function name */
	zFunc = jx9_function_name(pCtx);
	/* Set the default pattern match routine */
	xMatch = SyBlobSearch;
	if( SyStrncmp(zFunc, "str_ireplace", sizeof("str_ireplace") - 1) ==  0 ){
		/* Case insensitive pattern match */
		xMatch = iPatternMatch;
	}
	/* Start the replace process */
	while( SXRET_OK == SySetGetNextEntry(&sSearch, (void **)&pSearch) ){
		sxu32 nCount, nOfft;
		if( pSearch->nByte <  1 ){
			/* Empty string, ignore */
			continue;
		}
		/* Extract the replace string */
		if( rep_str ){
			pReplace = (SyString *)SySetPeek(&sReplace);
		}else{
			if( SXRET_OK != SySetGetNextEntry(&sReplace, (void **)&pReplace) ){
				/* Sepecial case when 'replace set' has fewer values than the search set.
				 * An empty string is used for the rest of replacement values
				 */
				pReplace = 0;
			}
		}
		if( pReplace == 0 ){
			/* Use an empty string instead */
			pReplace = &sTemp;
		}
		nOfft = nCount = 0;
		for(;;){
			if( nCount >= SyBlobLength(&sWorker) ){
				break;
			}
			/* Perform a pattern lookup */
			rc = xMatch(SyBlobDataAt(&sWorker, nCount), SyBlobLength(&sWorker) - nCount, (const void *)pSearch->zString, 
				pSearch->nByte, &nOfft);
			if( rc != SXRET_OK ){
				/* Pattern not found */
				break;
			}
			/* Perform the replace operation */
			StringReplace(&sWorker, nCount+nOfft, (int)pSearch->nByte, pReplace->zString, (int)pReplace->nByte);
			/* Increment offset counter */
			nCount += nOfft + pReplace->nByte;
		}
	}
	/* All done, clean-up the mess left behind */
	jx9_result_string(pCtx, (const char *)SyBlobData(&sWorker), (int)SyBlobLength(&sWorker));
	SySetRelease(&sSearch);
	SySetRelease(&sReplace);
	SyBlobRelease(&sWorker);
	return JX9_OK;
}